

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Point3<float> pbrt::Permute<pbrt::Point3,float>(Tuple3<pbrt::Point3,_float> *t,array<int,_3> p)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  int *piVar2;
  Tuple3<pbrt::Point3,_float> *in_RDI;
  Tuple3<pbrt::Point3,_float> *this;
  Tuple3<pbrt::Point3,_float> *this_00;
  array<int,_3> local_18;
  undefined8 local_c;
  float local_4;
  
  this = in_RDI;
  piVar2 = pstd::array<int,_3>::operator[](&local_18,0);
  Tuple3<pbrt::Point3,_float>::operator[](this,*piVar2);
  this_00 = in_RDI;
  piVar2 = pstd::array<int,_3>::operator[](&local_18,1);
  Tuple3<pbrt::Point3,_float>::operator[](this_00,*piVar2);
  piVar2 = pstd::array<int,_3>::operator[](&local_18,2);
  Tuple3<pbrt::Point3,_float>::operator[](in_RDI,*piVar2);
  Point3<float>::Point3((Point3<float> *)this_00,(float)((ulong)this >> 0x20),SUB84(this,0),0.0);
  TVar1.z = local_4;
  TVar1.x = (float)(undefined4)local_c;
  TVar1.y = (float)local_c._4_4_;
  return (Point3<float>)TVar1;
}

Assistant:

PBRT_CPU_GPU inline C<T> Permute(const Tuple3<C, T> &t, pstd::array<int, 3> p) {
    return {t[p[0]], t[p[1]], t[p[2]]};
}